

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

size_t stackjit::TypeSystem::sizeOfType(Type *type)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  PrimitiveTypes primitiveType;
  string typeName;
  PrimitiveTypes local_69;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  string local_48;
  
  pcVar1 = (type->mName)._M_dataplus._M_p;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + (type->mName)._M_string_length);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_68,local_68 + local_60);
  bVar2 = fromString(&local_48,&local_69);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if (bVar2) {
    if ((byte)(local_69 - Integer) < 4) {
      sVar4 = *(size_t *)(&DAT_00179a90 + (ulong)(byte)(local_69 - Integer) * 8);
    }
    else {
      sVar4 = 0;
    }
  }
  else {
    uVar3 = (*type->_vptr_Type[2])(type);
    sVar4 = (size_t)((uVar3 & 0xff) << 3);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return sVar4;
}

Assistant:

std::size_t TypeSystem::sizeOfType(const Type* type) {
		auto typeName = type->name();
		PrimitiveTypes primitiveType;

		if (fromString(typeName, primitiveType)) {
			return sizeOfType(primitiveType);
		} else if (type->isReference()) {
			return sizeof(BytePtr);
		}

		return 0;
	}